

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.hpp
# Opt level: O2

void __thiscall
oqpi::scheduler<concurrent_queue>::signalAvailableWorker
          (scheduler<concurrent_queue> *this,worker_base *w)

{
  bool bVar1;
  task_handle hTask;
  element_type *local_40;
  
  do {
    waitForNextTask((scheduler<concurrent_queue> *)&stack0xffffffffffffffc0,(worker_base *)this);
    if (((this->running_)._M_base._M_i & 1U) == 0) {
LAB_0019898d:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      return;
    }
    if (local_40 == (element_type *)0x0) {
LAB_0019894d:
      bVar1 = assert_and_return_false
                        ("/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/scheduler.hpp"
                         ,0x129,"hTask.isValid() && hTask.isGrabbed()","");
      if (bVar1) goto LAB_0019896a;
    }
    else {
      bVar1 = task_handle::isGrabbed((task_handle *)&stack0xffffffffffffffc0);
      if (!bVar1) goto LAB_0019894d;
LAB_0019896a:
      bVar1 = task_handle::isDone((task_handle *)&stack0xffffffffffffffc0);
      if (!bVar1) {
        worker_base::assign(w,(task_handle *)&stack0xffffffffffffffc0);
        goto LAB_0019898d;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  } while( true );
}

Assistant:

void signalAvailableWorker(worker_base &w)
        {
            // Loop until we find a task to work on
            while (true)
            {
                // Grab the next task
                task_handle hTask = waitForNextTask(w);

                // We could have been waken up to stop
                if (!running_.load())
                {
                    return;
                }

                // Make sure it's runnable
                if (oqpi_ensure(hTask.isValid() && hTask.isGrabbed()))
                {
                    // Make sure it's not done (activeWait on groups can leave a task done without being grabbed)
                    if (!hTask.isDone())
                    {
                        // Assign it to the available worker
                        w.assign(std::move(hTask));

                        // We got a task! See ya!
                        break;
                    }
                }
            }
        }